

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O1

String * axl::io::getTempDir(void)

{
  char *p;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDI;
  String tmpDir;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_30;
  
  p = getenv("TMPDIR");
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_30,p,0xffffffffffffffff);
  if (local_30.m_length == 0) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
              (in_RDI,"/tmp",0xffffffffffffffff);
  }
  else {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
              (in_RDI,(StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_30);
  }
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_30);
  return in_RDI;
}

Assistant:

sl::String
getTempDir() {
#if (_AXL_OS_WIN)
	return getTempDir_w();
#else
	sl::String tmpDir = ::getenv("TMPDIR");
	return !tmpDir.isEmpty() ? tmpDir : "/tmp";
#endif
}